

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O0

void __thiscall iqnet::ssl::exception::exception(exception *this)

{
  ulong uVar1;
  char *__s;
  allocator<char> local_11;
  exception *local_10;
  exception *this_local;
  
  local_10 = this;
  std::exception::exception(&this->super_exception);
  *(undefined ***)this = &PTR__exception_00254698;
  uVar1 = ERR_get_error();
  this->ssl_err = uVar1;
  __s = ERR_reason_error_string(this->ssl_err);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->msg,__s,&local_11);
  std::allocator<char>::~allocator(&local_11);
  std::__cxx11::string::insert((ulong)&this->msg,(char *)0x0);
  return;
}

Assistant:

exception::exception() throw():
  ssl_err( ERR_get_error() ),
  msg( ERR_reason_error_string(ssl_err) )
{
  msg.insert(0, "SSL: ");
}